

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwFunctions.cpp
# Opt level: O1

void eglw::initExtensions(Functions *dst,FunctionLoader *loader)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglClientWaitSyncKHR");
  dst->clientWaitSyncKHR = (eglClientWaitSyncKHRFunc)CONCAT44(extraout_var,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreateImageKHR");
  dst->createImageKHR = (eglCreateImageKHRFunc)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePlatformPixmapSurfaceEXT");
  dst->createPlatformPixmapSurfaceEXT =
       (eglCreatePlatformPixmapSurfaceEXTFunc)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreatePlatformWindowSurfaceEXT");
  dst->createPlatformWindowSurfaceEXT =
       (eglCreatePlatformWindowSurfaceEXTFunc)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglCreateSyncKHR");
  dst->createSyncKHR = (eglCreateSyncKHRFunc)CONCAT44(extraout_var_03,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglDestroyImageKHR");
  dst->destroyImageKHR = (eglDestroyImageKHRFunc)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglDestroySyncKHR");
  dst->destroySyncKHR = (eglDestroySyncKHRFunc)CONCAT44(extraout_var_05,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetPlatformDisplayEXT");
  dst->getPlatformDisplayEXT = (eglGetPlatformDisplayEXTFunc)CONCAT44(extraout_var_06,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglGetSyncAttribKHR");
  dst->getSyncAttribKHR = (eglGetSyncAttribKHRFunc)CONCAT44(extraout_var_07,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglLockSurfaceKHR");
  dst->lockSurfaceKHR = (eglLockSurfaceKHRFunc)CONCAT44(extraout_var_08,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglSetDamageRegionKHR");
  dst->setDamageRegionKHR = (eglSetDamageRegionKHRFunc)CONCAT44(extraout_var_09,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglSignalSyncKHR");
  dst->signalSyncKHR = (eglSignalSyncKHRFunc)CONCAT44(extraout_var_10,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglSwapBuffersWithDamageKHR");
  dst->swapBuffersWithDamageKHR = (eglSwapBuffersWithDamageKHRFunc)CONCAT44(extraout_var_11,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglUnlockSurfaceKHR");
  dst->unlockSurfaceKHR = (eglUnlockSurfaceKHRFunc)CONCAT44(extraout_var_12,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"eglWaitSyncKHR");
  dst->waitSyncKHR = (eglWaitSyncKHRFunc)CONCAT44(extraout_var_13,iVar1);
  return;
}

Assistant:

void initExtensions (Functions* dst, const FunctionLoader* loader)
{
#include "eglwInitExtensions.inl"
}